

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileDisposal.cpp
# Opt level: O2

void inputParticle(Particle *particle,int filenum,char *seq)

{
  char *pcVar1;
  double *pdVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  int j;
  int iVar8;
  ifstream inFile;
  byte abStack_320 [488];
  char buffer [256];
  
  std::ifstream::ifstream(&inFile);
  pcVar1 = catStrStr(inputAddress,"particleO_");
  pcVar1 = catStrIntStr(pcVar1,filenum + 1,".txt");
  openFile(pcVar1,&inFile);
  iVar8 = 1;
  iVar5 = -3;
  while ((abStack_320[*(long *)(_inFile + -0x18)] & 2) == 0) {
    std::istream::getline((char *)&inFile,(long)buffer);
    iVar8 = iVar8 + -1;
    iVar5 = iVar5 + 3;
  }
  particle->numAA = -iVar8 / 4;
  particle->numAtom = (-iVar8 / 4) * 3;
  std::ifstream::close();
  openFile(pcVar1,&inFile);
  uVar4 = (long)iVar5 << 3;
  if (iVar8 == 1) {
    uVar4 = 0xffffffffffffffff;
  }
  pdVar2 = (double *)operator_new__(uVar4);
  particle->addO_origin = pdVar2;
  iVar8 = particle->numAA;
  uVar4 = (long)(iVar8 * 9) * 8;
  if (iVar8 * 9 < 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pdVar2 = (double *)operator_new__(uVar4);
  particle->origin = pdVar2;
  lVar6 = 0;
  uVar4 = 0;
  iVar5 = 0;
  while( true ) {
    if ((long)(iVar8 * 0xc) <= (long)uVar4) break;
    std::istream::_M_extract<double>((double *)&inFile);
    if ((uint)((uVar4 & 0xffffffff) % 0xc) < 9) {
      lVar3 = (long)iVar5;
      iVar5 = iVar5 + 1;
      particle->origin[lVar3] = *(double *)((long)particle->addO_origin + lVar6);
    }
    uVar4 = uVar4 + 1;
    iVar8 = particle->numAA;
    lVar6 = lVar6 + 8;
  }
  particle->sizeOfAddO_origin = iVar8 * 0xc;
  particle->sizeOfOrigin = iVar8 * 9;
  std::ifstream::close();
  operator_delete(pcVar1);
  pcVar1 = catStrStr(inputAddress,"phi");
  pcVar1 = catStrIntStr(pcVar1,filenum + 1,".txt");
  openFile(pcVar1,&inFile);
  uVar7 = (ulong)particle->numAA;
  uVar4 = uVar7 * 0x18 - 0x18;
  if ((long)uVar7 < 1) {
    uVar4 = 0xffffffffffffffff;
  }
  pdVar2 = (double *)operator_new__(uVar4);
  particle->Position = pdVar2;
  lVar6 = 0x10;
  for (lVar3 = 0; lVar3 < (int)uVar7 * 3 + -5; lVar3 = lVar3 + 3) {
    std::istream::_M_extract<double>((double *)&inFile);
    *(undefined8 *)((long)particle->Position + lVar6 + -8) = 0x4066800000000000;
    std::istream::_M_extract<double>((double *)&inFile);
    uVar7 = (ulong)(uint)particle->numAA;
    lVar6 = lVar6 + 0x18;
  }
  std::ifstream::close();
  particle->sizeOfPosition = particle->numAA * 3 + -3;
  pdVar2 = (double *)operator_new__(8);
  particle->Cost = pdVar2;
  particle->index = filenum;
  particle->seq = seq;
  std::ifstream::~ifstream(&inFile);
  return;
}

Assistant:

void inputParticle(Particle &particle, int filenum, char *seq){
    ifstream inFile;
    char *fileAddress;
    char *filename;
    fileAddress = catStrStr(inputAddress, "particleO_");
    filename = catStrIntStr(fileAddress, filenum+1, ".txt");
    openFile(filename, inFile);
    char buffer[256];
    // get the number of lines of the input file
    int cntLines = 0;
    while (! inFile.eof()) { inFile.getline(buffer, 256); cntLines++; }
    cntLines--;
    particle.numAA = cntLines/4;                                            // the number of AA
    particle.numAtom = particle.numAA *3;                          // the number of atoms ( not add O)
    inFile.close();                                                                         //get how many lines the input has

    // read the file to get the coordinaries
    openFile(filename, inFile);
    particle.addO_origin = new double[3*cntLines];                  //  the x,y,z of every atoms in the particle
    particle.origin = new double[particle.numAA*3 *3];          //  x,y,z, delete the number of the atom O
    int k=0;
    //  read the file by lines
    for (int j=0; j<12 * particle.numAA; j++){
        inFile >> particle.addO_origin[j];
        if (j % 12<9)
            particle.origin[k++] = particle.addO_origin[j];
    }
    particle.sizeOfAddO_origin = particle.numAA*4*3;
    particle.sizeOfOrigin = particle.numAA*3*3;                 //  the totally number of coordinaries
    inFile.close();
    delete filename;

    //  read the init angles
    fileAddress = catStrStr(inputAddress, "phi");
    filename = catStrIntStr(fileAddress, filenum+1, ".txt");
    openFile(filename, inFile);
    particle.Position = new double[3 * particle.numAA-3];     //   why so many 180  ?

    for (int j=0; j< 3*particle.numAA-5; j+=3){          // last : j=3*numAA-6; j+2=3*numAA-4
        inFile >> particle.Position[j] ;
        particle.Position[j+1] = 180;
        inFile >> particle.Position[j+2] ;
    }

    inFile.close();
    particle.sizeOfPosition = 3*particle.numAA-3;

    //  init particle.cost[]
    particle.Cost = new double [numObjective];

    particle.index = filenum;
    particle.seq = seq;

}